

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalParse
          (CodeGeneratorResponse *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  ParseContext *in_RDX;
  uint32 *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  HasBits has_bits;
  ParseContext *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffd0;
  HasBits<1UL> in_stack_ffffffffffffffd4;
  ParseContext *p;
  
  p = in_RDI;
  memset(&stack0xffffffffffffffd4,0,4);
LAB_004b4da2:
  do {
    bVar1 = internal::ParseContext::Done
                      ((ParseContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                       ,(char **)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_004b4f6c;
    in_RSI = (uint32 *)internal::ReadTag((char *)p,in_RSI,(uint32)((ulong)in_RDX >> 0x20));
    if (in_RSI == (uint32 *)0x0) goto LAB_004b4f89;
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffd0 >> 3;
    if (in_stack_ffffffffffffffc4 == 1) {
      if ((in_stack_ffffffffffffffd0 & 0xff) != 10) goto LAB_004b4f0e;
      _internal_mutable_error_abi_cxx11_
                ((CodeGeneratorResponse *)CONCAT44(1,in_stack_ffffffffffffffc0));
      in_RSI = (uint32 *)
               internal::InlineGreedyStringParserUTF8Verify
                         ((string *)
                          CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],in_stack_ffffffffffffffd0)
                          ,(char *)in_RDI,
                          (ParseContext *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (char *)in_stack_ffffffffffffffb8);
    }
    else {
      if ((in_stack_ffffffffffffffc4 == 0xf) && ((in_stack_ffffffffffffffd0 & 0xff) == 0x7a)) {
        do {
          in_stack_ffffffffffffffb8 = in_RDX;
          in_RDX = in_stack_ffffffffffffffb8;
          _internal_add_file((CodeGeneratorResponse *)0x4b4eb2);
          in_RSI = (uint32 *)
                   internal::ParseContext::
                   ParseMessage<google::protobuf::compiler::CodeGeneratorResponse_File>
                             (in_RDX,(CodeGeneratorResponse_File *)
                                     CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                              in_stack_ffffffffffffffd0),(char *)in_RDI);
          if (in_RSI == (uint32 *)0x0) goto LAB_004b4f89;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,(char *)in_RSI);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<122u>((char *)in_RSI), bVar1));
        goto LAB_004b4da2;
      }
LAB_004b4f0e:
      if (((in_stack_ffffffffffffffd0 & 7) == 4) || (in_stack_ffffffffffffffd0 == 0)) {
        internal::EpsCopyInputStream::SetLastTag
                  (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffd0);
        goto LAB_004b4f6c;
      }
      in_RSI = (uint32 *)
               internal::UnknownFieldParse
                         ((uint32)((ulong)in_RSI >> 0x20),(InternalMetadataWithArena *)in_RDX,
                          (char *)CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                           in_stack_ffffffffffffffd0),in_RDI);
    }
    if (in_RSI == (uint32 *)0x0) {
LAB_004b4f89:
      in_RSI = (uint32 *)0x0;
LAB_004b4f6c:
      internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
                 (HasBits<1UL> *)&stack0xffffffffffffffd4);
      return (char *)in_RSI;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorResponse::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string error = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_error(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.error");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}